

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

void __thiscall
libtorrent::dht::node::put_item
          (node *this,public_key *pk,string *salt,
          function<void_(const_libtorrent::dht::item_&,_int)> *f,
          function<void_(libtorrent::dht::item_&)> *data_cb)

{
  tuple<std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::put_data>,_std::function<void_(libtorrent::dht::item_&)>_>
  *this_00;
  dht_observer *pdVar1;
  int iVar2;
  function<void_(const_libtorrent::dht::item_&,_int)> *out;
  span<const_char> in;
  shared_ptr<libtorrent::dht::put_data> put_ta;
  shared_ptr<libtorrent::dht::get_item> ta;
  char hex_key [65];
  undefined1 local_b9;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  string *local_a8;
  _Bind<void_(*(std::_Placeholder<1>,_std::shared_ptr<libtorrent::dht::put_data>))(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_std::shared_ptr<libtorrent::dht::put_data>_&)>
  local_a0;
  long *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  _Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::put_data>,_std::function<void_(libtorrent::dht::item_&)>))(const_libtorrent::dht::item_&,_bool,_const_std::shared_ptr<libtorrent::dht::put_data>_&,_const_std::function<void_(libtorrent::dht::item_&)>_&)>
  local_78;
  
  pdVar1 = this->m_observer;
  local_a8 = salt;
  if (pdVar1 != (dht_observer *)0x0) {
    out = f;
    iVar2 = (**(pdVar1->super_dht_logger)._vptr_dht_logger)(pdVar1,1);
    if ((char)iVar2 != '\0') {
      in.m_len = (difference_type)&local_78;
      in.m_ptr = (char *)0x20;
      aux::to_hex((aux *)pk,in,(char *)out);
      (*(this->m_observer->super_dht_logger)._vptr_dht_logger[1])
                (this->m_observer,1,"starting put for [ key: %s ]",&local_78);
    }
  }
  ::std::__shared_ptr<libtorrent::dht::put_data,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<libtorrent::dht::put_data>,libtorrent::dht::node&,std::function<void(libtorrent::dht::item_const&,int)>&>
            ((__shared_ptr<libtorrent::dht::put_data,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             (allocator<libtorrent::dht::put_data> *)&local_78,this,f);
  local_78._M_f = anon_unknown_0::put_data_cb;
  this_00 = &local_78._M_bound_args;
  ::std::
  _Tuple_impl<2ul,std::shared_ptr<libtorrent::dht::put_data>,std::function<void(libtorrent::dht::item&)>>
  ::
  _Tuple_impl<std::shared_ptr<libtorrent::dht::put_data>&,std::function<void(libtorrent::dht::item&)>&,void>
            ((_Tuple_impl<2ul,std::shared_ptr<libtorrent::dht::put_data>,std::function<void(libtorrent::dht::item&)>>
              *)this_00,(shared_ptr<libtorrent::dht::put_data> *)&local_b8,data_cb);
  local_a0._M_f = anon_unknown_0::put;
  local_a0._M_bound_args.
  super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::shared_ptr<libtorrent::dht::put_data>_>.
  super__Tuple_impl<1UL,_std::shared_ptr<libtorrent::dht::put_data>_>.
  super__Head_base<1UL,_std::shared_ptr<libtorrent::dht::put_data>,_false>._M_head_impl.
  super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_b8;
  local_a0._M_bound_args.
  super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::shared_ptr<libtorrent::dht::put_data>_>.
  super__Tuple_impl<1UL,_std::shared_ptr<libtorrent::dht::put_data>_>.
  super__Head_base<1UL,_std::shared_ptr<libtorrent::dht::put_data>,_false>._M_head_impl.
  super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_b0;
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_b0->_M_use_count = local_b0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_b0->_M_use_count = local_b0->_M_use_count + 1;
    }
  }
  ::std::__shared_ptr<libtorrent::dht::get_item,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<libtorrent::dht::get_item>,libtorrent::dht::node&,libtorrent::dht::public_key_const&,std::__cxx11::string_const&,std::_Bind<void(*(std::_Placeholder<1>,std::_Placeholder<2>,std::shared_ptr<libtorrent::dht::put_data>,std::function<void(libtorrent::dht::item&)>))(libtorrent::dht::item_const&,bool,std::shared_ptr<libtorrent::dht::put_data>const&,std::function<void(libtorrent::dht::item&)>const&)>,std::_Bind<void(*(std::_Placeholder<1>,std::shared_ptr<libtorrent::dht::put_data>))(std::vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>const&,std::shared_ptr<libtorrent::dht::put_data>const&)>>
            ((__shared_ptr<libtorrent::dht::get_item,(__gnu_cxx::_Lock_policy)2> *)&local_88,
             (allocator<libtorrent::dht::get_item> *)&local_b9,this,pk,local_a8,&local_78,&local_a0)
  ;
  if (local_a0._M_bound_args.
      super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::shared_ptr<libtorrent::dht::put_data>_>.
      super__Tuple_impl<1UL,_std::shared_ptr<libtorrent::dht::put_data>_>.
      super__Head_base<1UL,_std::shared_ptr<libtorrent::dht::put_data>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0._M_bound_args.
               super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::shared_ptr<libtorrent::dht::put_data>_>
               .super__Tuple_impl<1UL,_std::shared_ptr<libtorrent::dht::put_data>_>.
               super__Head_base<1UL,_std::shared_ptr<libtorrent::dht::put_data>,_false>._M_head_impl
               .super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78._M_bound_args.
      super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::put_data>,_std::function<void_(libtorrent::dht::item_&)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::put_data>,_std::function<void_(libtorrent::dht::item_&)>_>
      .
      super__Tuple_impl<2UL,_std::shared_ptr<libtorrent::dht::put_data>,_std::function<void_(libtorrent::dht::item_&)>_>
      .super__Head_base<2UL,_std::shared_ptr<libtorrent::dht::put_data>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78._M_bound_args.
               super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::put_data>,_std::function<void_(libtorrent::dht::item_&)>_>
               .
               super__Tuple_impl<1UL,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::put_data>,_std::function<void_(libtorrent::dht::item_&)>_>
               .
               super__Tuple_impl<2UL,_std::shared_ptr<libtorrent::dht::put_data>,_std::function<void_(libtorrent::dht::item_&)>_>
               .super__Head_base<2UL,_std::shared_ptr<libtorrent::dht::put_data>,_false>.
               _M_head_impl.
               super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_78._M_bound_args.
      super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::put_data>,_std::function<void_(libtorrent::dht::item_&)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::put_data>,_std::function<void_(libtorrent::dht::item_&)>_>
      .
      super__Tuple_impl<2UL,_std::shared_ptr<libtorrent::dht::put_data>,_std::function<void_(libtorrent::dht::item_&)>_>
      .super__Tuple_impl<3UL,_std::function<void_(libtorrent::dht::item_&)>_>.
      super__Head_base<3UL,_std::function<void_(libtorrent::dht::item_&)>,_false>._M_head_impl.
      super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_78._M_bound_args.
      super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::put_data>,_std::function<void_(libtorrent::dht::item_&)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::put_data>,_std::function<void_(libtorrent::dht::item_&)>_>
      .
      super__Tuple_impl<2UL,_std::shared_ptr<libtorrent::dht::put_data>,_std::function<void_(libtorrent::dht::item_&)>_>
      .super__Tuple_impl<3UL,_std::function<void_(libtorrent::dht::item_&)>_>.
      super__Head_base<3UL,_std::function<void_(libtorrent::dht::item_&)>,_false>._M_head_impl.
      super__Function_base._M_manager)((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  (**(code **)(*local_88 + 0x18))();
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
  return;
}

Assistant:

void node::put_item(public_key const& pk, std::string const& salt
	, std::function<void(item const&, int)> f
	, std::function<void(item&)> data_cb)
{
#ifndef TORRENT_DISABLE_LOGGING
	if (m_observer != nullptr && m_observer->should_log(dht_logger::node))
	{
		char hex_key[65];
		aux::to_hex(pk.bytes, hex_key);
		m_observer->log(dht_logger::node, "starting put for [ key: %s ]", hex_key);
	}
#endif

	auto put_ta = std::make_shared<dht::put_data>(*this, f);

	auto ta = std::make_shared<dht::get_item>(*this, pk, salt
		, std::bind(&put_data_cb, _1, _2, put_ta, data_cb)
		, std::bind(&put, _1, put_ta));
	ta->start();
}